

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockingqueue.hpp
# Opt level: O2

function<void_()> * __thiscall
BlockingQueue<std::function<void_()>_>::pop
          (function<void_()> *__return_storage_ptr__,BlockingQueue<std::function<void_()>_> *this)

{
  unique_lock<std::mutex> lock;
  Item item;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->mutex);
  std::condition_variable::wait<BlockingQueue<std::function<void()>>::pop()::_lambda()_1_>
            (&this->itemsNotEmpty,&lock,(anon_class_8_1_8991fb9c)this);
  Item::Item(&item,(this->items).c.
                   super__Deque_base<BlockingQueue<std::function<void_()>_>::Item,_std::allocator<BlockingQueue<std::function<void_()>_>::Item>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur);
  std::
  deque<BlockingQueue<std::function<void_()>_>::Item,_std::allocator<BlockingQueue<std::function<void_()>_>::Item>_>
  ::pop_front(&(this->items).c);
  if (item.size != 0) {
    if (this->totalSize < item.size) {
      __assert_fail("totalSize >= item.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/src/blockingqueue.hpp"
                    ,0x2e,
                    "T BlockingQueue<std::function<void ()>>::pop() [T = std::function<void ()>]");
    }
    this->totalSize = this->totalSize - item.size;
    std::unique_lock<std::mutex>::unlock(&lock);
    std::condition_variable::notify_all();
  }
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = item.value._M_invoker;
  if (item.value.super__Function_base._M_manager != (_Manager_type)0x0) {
    *(void **)&(__return_storage_ptr__->super__Function_base)._M_functor =
         item.value.super__Function_base._M_functor._M_unused._M_object;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) =
         item.value.super__Function_base._M_functor._8_8_;
    (__return_storage_ptr__->super__Function_base)._M_manager =
         item.value.super__Function_base._M_manager;
    item.value.super__Function_base._M_manager = (_Manager_type)0x0;
    item.value._M_invoker = (_Invoker_type)0x0;
  }
  std::_Function_base::~_Function_base((_Function_base *)&item);
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return __return_storage_ptr__;
}

Assistant:

T pop()
	{
		std::unique_lock<std::mutex> lock(mutex);

		itemsNotEmpty.wait(lock, [&]() { return !items.empty(); });

		Item item = std::move(items.front());
		items.pop();

		if (item.size > 0)
		{
			assert(totalSize >= item.size);
			totalSize -= item.size;

			lock.unlock();
			itemsNotFull.notify_all();
		}

		return std::move(item.value);
	}